

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::BeginQuery(DeviceContextGLImpl *this,IQuery *pQuery)

{
  QUERY_TYPE QVar1;
  GLuint GVar2;
  DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc> *this_00;
  QueryDesc *pQVar3;
  Char *pCVar4;
  undefined1 local_f0 [8];
  string msg_4;
  string msg_3;
  undefined1 local_a8 [4];
  GLenum err_3;
  string msg_2;
  undefined1 local_80 [4];
  GLenum err_2;
  string msg_1;
  GLenum err_1;
  undefined1 local_50 [8];
  string msg;
  GLenum err;
  GLuint glQuery;
  QUERY_TYPE QueryType;
  QueryGLImpl *pQueryGLImpl;
  IQuery *pQuery_local;
  DeviceContextGLImpl *this_local;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginQuery
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pQuery,0);
  this_00 = (DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
             *)ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  pQVar3 = DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>::
           GetDesc(this_00);
  QVar1 = pQVar3->Type;
  GVar2 = QueryGLImpl::GetGlQueryHandle((QueryGLImpl *)this_00);
  switch(QVar1) {
  case QUERY_TYPE_OCCLUSION:
    (*__glewBeginQuery)(0x8914,GVar2);
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[40],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645,(char (*) [40])"Failed to begin GL_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_50,(char (*) [6])0x4585f6);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645);
      std::__cxx11::string::~string((string *)local_50);
    }
    break;
  case QUERY_TYPE_BINARY_OCCLUSION:
    (*__glewBeginQuery)(0x8c2f,GVar2);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[44],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d,(char (*) [44])"Failed to begin GL_ANY_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_80,(char (*) [6])0x4585f6);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d);
      std::__cxx11::string::~string((string *)local_80);
    }
    break;
  default:
    FormatString<char[22]>((string *)local_f0,(char (*) [22])"Unexpected query type");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x663);
    std::__cxx11::string::~string((string *)local_f0);
    break;
  case QUERY_TYPE_PIPELINE_STATISTICS:
    (*__glewBeginQuery)(0x8c87,GVar2);
    msg_2.field_2._12_4_ = glGetError();
    if (msg_2.field_2._12_4_ != 0) {
      LogError<false,char[46],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653,(char (*) [46])"Failed to begin GL_PRIMITIVES_GENERATED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_a8,(char (*) [6])0x4585f6);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653);
      std::__cxx11::string::~string((string *)local_a8);
    }
    break;
  case QUERY_TYPE_DURATION:
    (*__glewBeginQuery)(0x88bf,GVar2);
    msg_3.field_2._12_4_ = glGetError();
    if (msg_3.field_2._12_4_ != 0) {
      LogError<false,char[38],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c,(char (*) [38])"Failed to begin GL_TIME_ELAPSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)((long)&msg_4.field_2 + 8),(char (*) [6])0x4585f6);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BeginQuery(IQuery* pQuery)
{
    TDeviceContextBase::BeginQuery(pQuery, 0);

    QueryGLImpl* pQueryGLImpl = ClassPtrCast<QueryGLImpl>(pQuery);
    QUERY_TYPE   QueryType    = pQueryGLImpl->GetDesc().Type;
    GLuint       glQuery      = pQueryGLImpl->GetGlQueryHandle();

    switch (QueryType)
    {
        case QUERY_TYPE_OCCLUSION:
#if GL_SAMPLES_PASSED
            glBeginQuery(GL_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_SAMPLES_PASSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_SAMPLES_PASSED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_BINARY_OCCLUSION:
            glBeginQuery(GL_ANY_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_ANY_SAMPLES_PASSED query");
            break;

        case QUERY_TYPE_PIPELINE_STATISTICS:
#if GL_PRIMITIVES_GENERATED
            glBeginQuery(GL_PRIMITIVES_GENERATED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_PRIMITIVES_GENERATED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_PRIMITIVES_GENERATED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_DURATION:
#if GL_TIME_ELAPSED
            glBeginQuery(GL_TIME_ELAPSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_TIME_ELAPSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("Duration queries are not supported by this device");
#endif
            break;

        default:
            UNEXPECTED("Unexpected query type");
    }
}